

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O2

RemoteGraph * Omega_h::get_own_verts2own_elems(RemoteGraph *__return_storage_ptr__,Mesh *mesh)

{
  LOs own_verts2serv_uses;
  Remotes local_190;
  Remotes serv_uses2own_elems;
  Remotes local_uses2own_elems;
  Dist local_uses2own_verts;
  Dist own_verts2local_uses;
  
  get_local_elem_uses2own_elems(&local_uses2own_elems,mesh);
  get_local_elem_uses2own_verts(&local_uses2own_verts,mesh);
  Remotes::Remotes(&local_190,&local_uses2own_elems);
  Dist::exch(&serv_uses2own_elems,&local_uses2own_verts,&local_190,1);
  Remotes::~Remotes(&local_190);
  Dist::invert(&own_verts2local_uses,&local_uses2own_verts);
  Dist::roots2items((Dist *)&own_verts2serv_uses);
  Write<int>::Write((Write<int> *)__return_storage_ptr__,&own_verts2serv_uses.write_);
  Remotes::Remotes(&__return_storage_ptr__->edges2remotes,&serv_uses2own_elems);
  Write<int>::~Write(&own_verts2serv_uses.write_);
  Dist::~Dist(&own_verts2local_uses);
  Remotes::~Remotes(&serv_uses2own_elems);
  Dist::~Dist(&local_uses2own_verts);
  Remotes::~Remotes(&local_uses2own_elems);
  return __return_storage_ptr__;
}

Assistant:

static RemoteGraph get_own_verts2own_elems(Mesh* mesh) {
  auto local_uses2own_elems = get_local_elem_uses2own_elems(mesh);
  auto local_uses2own_verts = get_local_elem_uses2own_verts(mesh);
  auto serv_uses2own_elems = local_uses2own_verts.exch(local_uses2own_elems, 1);
  auto own_verts2local_uses = local_uses2own_verts.invert();
  auto own_verts2serv_uses = own_verts2local_uses.roots2items();
  return {own_verts2serv_uses, serv_uses2own_elems};
}